

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UintTypes.cpp
# Opt level: O2

string * __thiscall
jbcoin::to_string_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,Currency *currency)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int in_ECX;
  char *text;
  base_uint<160UL,_jbcoin::detail::CurrencyTag> local_2c;
  
  if ((to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
       allowed_characters_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                                   ::allowed_characters_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
                allowed_characters_abi_cxx11_,
               "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789<>(){}[]|?!@#$%^&*",
               (allocator *)&local_2c);
    __cxa_atexit(std::__cxx11::string::~string,
                 &to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
                  allowed_characters_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                         ::allowed_characters_abi_cxx11_);
  }
  bVar1 = beast::operator==(this);
  if (bVar1) {
    systemCurrencyCode_abi_cxx11_();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&systemCurrencyCode[abi:cxx11]()::code_abi_cxx11_);
  }
  else {
    noCurrency();
    bVar1 = operator==((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)this,&noCurrency::currency);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"1",(allocator *)&local_2c);
    }
    else {
      if ((to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
           sIsoBits == '\0') &&
         (iVar2 = __cxa_guard_acquire(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                                       ::sIsoBits), iVar2 != 0)) {
        from_hex_text<jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>>
                  (&to_string::sIsoBits,(jbcoin *)"FFFFFFFFFFFFFFFFFFFFFFFF000000FFFFFFFFFF",text);
        __cxa_guard_release(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                             ::sIsoBits);
      }
      operator&(&local_2c,(base_uint<160UL,_jbcoin::detail::CurrencyTag> *)this,&to_string::sIsoBits
               );
      bVar1 = beast::operator==(&local_2c);
      if (bVar1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)__return_storage_ptr__,this + 0xc,this + 0xf);
        systemCurrencyCode_abi_cxx11_();
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__return_storage_ptr__,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&systemCurrencyCode[abi:cxx11]()::code_abi_cxx11_);
        if ((bVar1) &&
           (lVar3 = std::__cxx11::string::find_first_not_of
                              ((string *)__return_storage_ptr__,0x305280), lVar3 == -1)) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      strHex<unsigned_char_const*>(__return_storage_ptr__,this,(uchar *)0x14,in_ECX);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(Currency const& currency)
{
    // Characters we are willing to allow in the ASCII representation of a
    // three-letter currency code.
    static std::string const allowed_characters =
        "abcdefghijklmnopqrstuvwxyz"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "0123456789"
        "<>(){}[]|?!@#$%^&*";

    if (currency == zero)
        return systemCurrencyCode();

    if (currency == noCurrency())
        return "1";

    static Currency const sIsoBits (
        from_hex_text<Currency>("FFFFFFFFFFFFFFFFFFFFFFFF000000FFFFFFFFFF"));

    if ((currency & sIsoBits).isZero ())
    {
        // The offset of the 3 character ISO code in the currency descriptor
        int const isoOffset = 12;

        std::string const iso(
            currency.data () + isoOffset,
            currency.data () + isoOffset + 3);

        // Specifying the system currency code using ISO-style representation
        // is not allowed.
        if ((iso != systemCurrencyCode()) &&
            (iso.find_first_not_of (allowed_characters) == std::string::npos))
        {
            return iso;
        }
    }

    return strHex (currency.begin (), currency.size ());
}